

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::FString(FString *this,char head,FString *tail)

{
  size_t sVar1;
  size_t len2;
  FString *tail_local;
  char head_local;
  FString *this_local;
  
  sVar1 = Len(tail);
  AllocBuffer(this,sVar1 + 1);
  *this->Chars = head;
  StrCopy(this->Chars + 1,tail);
  return;
}

Assistant:

FString::FString (char head, const FString &tail)
{
	size_t len2 = tail.Len();
	AllocBuffer (1 + len2);
	Chars[0] = head;
	StrCopy (Chars + 1, tail);
}